

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O3

vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> * __thiscall
tiger::trains::world::Point::getTrains
          (vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
           *__return_storage_ptr__,Point *this)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  iterator __position;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *pvVar3;
  Point *pPVar4;
  pointer ppTVar5;
  Train *train;
  Train *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = World::getTrainList(this->owner);
  ppTVar5 = (pvVar3->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (pvVar3->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar5 != ppTVar2) {
    do {
      local_30 = *ppTVar5;
      pPVar4 = Train::getPoint(local_30);
      if (pPVar4 == this) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>::
          _M_realloc_insert<tiger::trains::world::Train*const&>
                    ((vector<tiger::trains::world::Train*,std::allocator<tiger::trains::world::Train*>>
                      *)__return_storage_ptr__,__position,&local_30);
        }
        else {
          *__position._M_current = local_30;
          pppTVar1 = &(__return_storage_ptr__->
                      super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
      }
      ppTVar5 = ppTVar5 + 1;
    } while (ppTVar5 != ppTVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<Train *> Point::getTrains() const
{
    std::vector<Train *> res;

    for (Train *train : owner->getTrainList())
        if (train->getPoint() == this)
            res.push_back(train);

    return res;
}